

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O3

xmlChar * xmlRelaxNGGetDataTypeLibrary(xmlRelaxNGParserCtxtPtr ctxt,xmlNodePtr node)

{
  int iVar1;
  xmlChar *str;
  xmlChar *pxVar2;
  long lVar3;
  
  if (*(long *)&ctxt->nbWarnings == 0) goto LAB_0018a4eb;
  if (*(int *)&ctxt->error != 1) goto LAB_0018a4eb;
  iVar1 = xmlStrEqual((xmlChar *)ctxt->warning,(xmlChar *)"data");
  lVar3 = *(long *)&ctxt->nbWarnings;
  if (iVar1 != 0) {
    iVar1 = xmlStrEqual(*(xmlChar **)(lVar3 + 0x10),(xmlChar *)"http://relaxng.org/ns/structure/1.0"
                       );
    if (iVar1 != 0) goto LAB_0018a4d7;
    lVar3 = *(long *)&ctxt->nbWarnings;
  }
  if (lVar3 == 0) goto LAB_0018a4eb;
  if (*(int *)&ctxt->error != 1) goto LAB_0018a4eb;
  iVar1 = xmlStrEqual((xmlChar *)ctxt->warning,"value");
  if (iVar1 == 0) goto LAB_0018a4eb;
  iVar1 = xmlStrEqual(*(xmlChar **)(*(long *)&ctxt->nbWarnings + 0x10),
                      (xmlChar *)"http://relaxng.org/ns/structure/1.0");
  if (iVar1 == 0) goto LAB_0018a4eb;
LAB_0018a4d7:
  do {
    str = xmlGetProp((xmlNode *)ctxt,(xmlChar *)"datatypeLibrary");
    if (str != (xmlChar *)0x0) {
      if (*str == '\0') {
        pxVar2 = (xmlChar *)0x0;
      }
      else {
        pxVar2 = xmlURIEscapeStr(str,(xmlChar *)":/#?");
        if (pxVar2 == (xmlChar *)0x0) {
          return str;
        }
      }
      (*xmlFree)(str);
      return pxVar2;
    }
LAB_0018a4eb:
    ctxt = (xmlRelaxNGParserCtxtPtr)ctxt->schema;
  } while ((ctxt != (xmlRelaxNGParserCtxtPtr)0x0) &&
          (*(xmlElementType *)&ctxt->error == XML_ELEMENT_NODE));
  return (xmlChar *)0x0;
}

Assistant:

static xmlChar *
xmlRelaxNGGetDataTypeLibrary(xmlRelaxNGParserCtxtPtr ctxt ATTRIBUTE_UNUSED,
                             xmlNodePtr node)
{
    xmlChar *ret, *escape;

    if (node == NULL)
        return(NULL);

    if ((IS_RELAXNG(node, "data")) || (IS_RELAXNG(node, "value"))) {
        ret = xmlGetProp(node, BAD_CAST "datatypeLibrary");
        if (ret != NULL) {
            if (ret[0] == 0) {
                xmlFree(ret);
                return (NULL);
            }
            escape = xmlURIEscapeStr(ret, BAD_CAST ":/#?");
            if (escape == NULL) {
                return (ret);
            }
            xmlFree(ret);
            return (escape);
        }
    }
    node = node->parent;
    while ((node != NULL) && (node->type == XML_ELEMENT_NODE)) {
        ret = xmlGetProp(node, BAD_CAST "datatypeLibrary");
        if (ret != NULL) {
            if (ret[0] == 0) {
                xmlFree(ret);
                return (NULL);
            }
            escape = xmlURIEscapeStr(ret, BAD_CAST ":/#?");
            if (escape == NULL) {
                return (ret);
            }
            xmlFree(ret);
            return (escape);
        }
        node = node->parent;
    }
    return (NULL);
}